

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::BeginFrameObserverState::BeginFrameObserverState
          (BeginFrameObserverState *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__BeginFrameObserverState_00407df0;
  this->dropped_begin_frame_args_ = 0;
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameArgs>::CopyablePtr
            (&this->last_begin_frame_args_);
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

BeginFrameObserverState::BeginFrameObserverState() = default;